

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O3

VertexDataDesc * vkt::pipeline::multisample::getVertexDataDescriptonNdcScreen(void)

{
  pointer *ppVVar1;
  iterator __position;
  VertexDataDesc *in_RDI;
  VkVertexInputAttributeDescription vertexAttribPositionScreen;
  VkVertexInputAttributeDescription vertexAttribPositionNdc;
  VkVertexInputAttributeDescription local_38;
  VkVertexInputAttributeDescription local_28;
  
  (in_RDI->vertexAttribDescVec).
  super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->vertexAttribDescVec).
  super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->vertexAttribDescVec).
  super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI->dataStride = 0x18;
  in_RDI->dataSize = 0x60;
  in_RDI->primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  in_RDI->verticesCount = 4;
  local_28.location = 0;
  local_28.binding = 0;
  local_28.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_28.offset = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
  ::_M_realloc_insert<vk::VkVertexInputAttributeDescription_const&>
            ((vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
              *)&in_RDI->vertexAttribDescVec,(iterator)0x0,&local_28);
  __position._M_current =
       (in_RDI->vertexAttribDescVec).
       super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.location = 1;
  local_38.binding = 0;
  local_38.format = VK_FORMAT_R32G32_SFLOAT;
  local_38.offset = 0x10;
  if (__position._M_current ==
      (in_RDI->vertexAttribDescVec).
      super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
    ::_M_realloc_insert<vk::VkVertexInputAttributeDescription_const&>
              ((vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
                *)&in_RDI->vertexAttribDescVec,__position,&local_38);
  }
  else {
    (__position._M_current)->location = 1;
    (__position._M_current)->binding = 0;
    (__position._M_current)->format = VK_FORMAT_R32G32_SFLOAT;
    (__position._M_current)->offset = 0x10;
    ppVVar1 = &(in_RDI->vertexAttribDescVec).
               super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return in_RDI;
}

Assistant:

MultisampleInstanceBase::VertexDataDesc getVertexDataDescriptonNdcScreen (void)
{
	MultisampleInstanceBase::VertexDataDesc vertexDataDesc;

	vertexDataDesc.verticesCount	 = 4u;
	vertexDataDesc.dataStride		 = sizeof(VertexDataNdcScreen);
	vertexDataDesc.dataSize			 = vertexDataDesc.verticesCount * vertexDataDesc.dataStride;
	vertexDataDesc.primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

	const VkVertexInputAttributeDescription vertexAttribPositionNdc =
	{
		0u,													// deUint32	location;
		0u,													// deUint32	binding;
		VK_FORMAT_R32G32B32A32_SFLOAT,						// VkFormat	format;
		DE_OFFSET_OF(VertexDataNdcScreen, positionNdc),		// deUint32	offset;
	};

	vertexDataDesc.vertexAttribDescVec.push_back(vertexAttribPositionNdc);

	const VkVertexInputAttributeDescription vertexAttribPositionScreen =
	{
		1u,													// deUint32	location;
		0u,													// deUint32	binding;
		VK_FORMAT_R32G32_SFLOAT,							// VkFormat	format;
		DE_OFFSET_OF(VertexDataNdcScreen, positionScreen),	// deUint32	offset;
	};

	vertexDataDesc.vertexAttribDescVec.push_back(vertexAttribPositionScreen);

	return vertexDataDesc;
}